

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  initializer_list<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  type_index local_210;
  allocator_type local_202;
  less<std::type_index> local_201;
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  typeToStringMap;
  shared_ptr<C<BaseVirtual>_> cvsp;
  shared_ptr<B<BaseVirtual>_> bvsp;
  shared_ptr<A<BaseVirtual>_> avsp;
  shared_ptr<C<Base>_> csp;
  shared_ptr<B<Base>_> bsp;
  type_index local_180;
  type_index local_178;
  shared_ptr<A<Base>_> asp;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  bsp.super___shared_ptr<B<Base>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&Base::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[5],_true>
            ((pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&asp,(type_index *)&bsp,(char (*) [5])0x10900b);
  csp.super___shared_ptr<C<Base>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&A<Base>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>
            (&local_148,(type_index *)&csp,(char (*) [6])"ABase");
  avsp.super___shared_ptr<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&B<Base>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>
            (&local_120,(type_index *)&avsp,(char (*) [6])"BBase");
  bvsp.super___shared_ptr<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&C<Base>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[6],_true>
            (&local_f8,(type_index *)&bvsp,(char (*) [6])"CBase");
  cvsp.super___shared_ptr<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&BaseVirtual::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[12],_true>
            (&local_d0,(type_index *)&cvsp,(char (*) [12])0x10901d);
  local_210._M_target = (type_info *)&A<BaseVirtual>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_a8,&local_210,(char (*) [13])"ABaseVirtual");
  local_178._M_target = (type_info *)&B<BaseVirtual>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_80,&local_178,(char (*) [13])"BBaseVirtual");
  local_180._M_target = (type_info *)&C<BaseVirtual>::typeinfo;
  std::
  pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::type_index,_const_char_(&)[13],_true>
            (&local_58,&local_180,(char (*) [13])"CBaseVirtual");
  __l._M_len = 8;
  __l._M_array = (iterator)&asp;
  std::
  map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&typeToStringMap,__l,&local_201,&local_202);
  lVar4 = 0x120;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&asp.super___shared_ptr<A<Base>,_(__gnu_cxx::_Lock_policy)2>._M_ptr + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x20);
  std::make_shared<A<Base>>();
  std::make_shared<B<Base>>();
  std::make_shared<C<Base>>();
  std::make_shared<A<BaseVirtual>>();
  std::make_shared<B<BaseVirtual>>();
  std::make_shared<C<BaseVirtual>>();
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&A<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&B<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&C<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = (**((avsp.super___shared_ptr<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_BaseVirtual)._vptr_BaseVirtual)();
  local_210._M_target = (type_info *)CONCAT44(extraout_var,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = (**((bvsp.super___shared_ptr<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_BaseVirtual)._vptr_BaseVirtual)();
  local_210._M_target = (type_info *)CONCAT44(extraout_var_00,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar1 = (**((cvsp.super___shared_ptr<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_BaseVirtual)._vptr_BaseVirtual)();
  local_210._M_target = (type_info *)CONCAT44(extraout_var_01,iVar1);
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&Base::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&A<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&B<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  local_210._M_target = (type_info *)&C<BaseVirtual>::typeinfo;
  pmVar2 = std::
           map<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&typeToStringMap,&local_210);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cvsp.super___shared_ptr<C<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bvsp.super___shared_ptr<B<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&avsp.super___shared_ptr<A<BaseVirtual>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&csp.super___shared_ptr<C<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bsp.super___shared_ptr<B<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&asp.super___shared_ptr<A<Base>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::type_index,_std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&typeToStringMap._M_t);
  return 0;
}

Assistant:

int main( int argc,
          char **argv )
{
  std::map<std::type_index, std::string> typeToStringMap = { { std::type_index( typeid(Base) ), "Base" }, { std::type_index( typeid(A<Base> ) ), "ABase" }, { std::type_index( typeid(B<Base> ) ), "BBase" }, { std::type_index( typeid(C<Base> ) ), "CBase" }, { std::type_index( typeid(BaseVirtual) ),
      "BaseVirtual" }, { std::type_index( typeid(A<BaseVirtual> ) ), "ABaseVirtual" }, { std::type_index( typeid(B<BaseVirtual> ) ), "BBaseVirtual" }, { std::type_index( typeid(C<BaseVirtual> ) ), "CBaseVirtual" } };

  A<Base> a;
  B<Base> b;
  C<Base> c;

  A<BaseVirtual> av;
  B<BaseVirtual> bv;
  C<BaseVirtual> cv;

  auto asp = std::make_shared<A<Base>>( );
  auto bsp = std::make_shared<B<Base>>( );
  auto csp = std::make_shared<C<Base>>( );

  auto avsp = std::make_shared<A<BaseVirtual>>( );
  auto bvsp = std::make_shared<B<BaseVirtual>>( );
  auto cvsp = std::make_shared<C<BaseVirtual>>( );

  A<Base>* ap = new A<Base>;
  B<Base>* bp = new B<Base>;
  C<Base>* cp = new C<Base>;

  A<BaseVirtual>* avp = new A<BaseVirtual>;
  B<BaseVirtual>* bvp = new B<BaseVirtual>;
  C<BaseVirtual>* cvp = new C<BaseVirtual>;

  std::cout << typeToStringMap[a.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[b.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[c.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[av.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bv.get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cv.get_type_index( )] << std::endl;

  std::cout << typeToStringMap[asp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[csp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvsp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvsp->get_type_index( )] << std::endl;

  std::cout << typeToStringMap[ap->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[avp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[bvp->get_type_index( )] << std::endl;
  std::cout << typeToStringMap[cvp->get_type_index( )] << std::endl;
}